

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O2

Path * tinyusdz::pathutil::FromString(Path *__return_storage_ptr__,string *_path_str)

{
  bool bVar1;
  ulong uVar2;
  string path_str;
  string prop_part;
  string prim_part;
  
  ::std::__cxx11::string::string((string *)&path_str,(string *)_path_str);
  if (path_str._M_string_length != 0) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &path_str,".");
    if (!bVar1) {
      uVar2 = ::std::__cxx11::string::find_last_of((char *)&path_str,0x31387e);
      if (uVar2 == 0xffffffffffffffff) {
LAB_001a9af0:
        ::std::__cxx11::string::string((string *)&prim_part,"",(allocator *)&prop_part);
        Path::Path(__return_storage_ptr__,&path_str,&prim_part);
      }
      else {
        if (uVar2 == path_str._M_string_length - 1) goto LAB_001a9ac6;
        if ((uVar2 < path_str._M_string_length - 1 && 1 < path_str._M_string_length) &&
           (path_str._M_dataplus._M_p[uVar2 + 1] == '/')) goto LAB_001a9af0;
        ::std::__cxx11::string::substr((ulong)&prim_part,(ulong)&path_str);
        ::std::__cxx11::string::substr((ulong)&prop_part,(ulong)&path_str);
        Path::Path(__return_storage_ptr__,&prim_part,&prop_part);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
      goto LAB_001a9b6b;
    }
  }
LAB_001a9ac6:
  Path::Path(__return_storage_ptr__);
LAB_001a9b6b:
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path FromString(const std::string &_path_str) {

  std::string path_str = _path_str;

  if (path_str.empty()) {
    return Path();
  }

  if (path_str == ".") {
    // invalid
    return Path();
  }

  size_t loc = path_str.find_last_of(".");
  if (loc != std::string::npos) {
    if (loc == (path_str.size() - 1)) {
      // ends with "."
      return Path();
    } else if ((path_str.size() > 1) && (loc < (path_str.size() - 1))) {
      if (path_str[loc+1] == '/') {
        // guess relative prim path only.
        return Path(path_str, "");
      }
    }
  }

  if (loc == std::string::npos) {
    // prim_part only
    return Path(path_str, "");
  }

  std::string prim_part = path_str.substr(0, loc);
  std::string prop_part = path_str.substr(loc+1);

  return Path(prim_part, prop_part);
}